

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

char * BinaryCache::GetBytecode(char *path)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  char *pcVar3;
  uint index;
  
  uVar1 = NULLC::GetStringHash(path);
  pcVar3 = lastBytecode;
  if (uVar1 != lastHash) {
    index = 0;
    while ((index < DAT_00243f64 &&
           (pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                               ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,
                                index), uVar1 != pCVar2->nameHash))) {
      index = index + 1;
    }
    if (DAT_00243f64 == index) {
      pcVar3 = (char *)0x0;
    }
    else {
      pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
      pcVar3 = pCVar2->binary;
    }
  }
  return pcVar3;
}

Assistant:

const char* BinaryCache::GetBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	if(hash == lastHash)
		return lastBytecode;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i != cache.size())
		return cache[i].binary;

	return NULL;
}